

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-validator.cpp
# Opt level: O0

void __thiscall wasm::FunctionValidator::visitArrayCopy(FunctionValidator *this,ArrayCopy *curr)

{
  bool bVar1;
  Module *pMVar2;
  byte local_d2;
  byte local_d1;
  Type local_b8 [2];
  Type *local_a8;
  Field *destElement;
  Field **local_90;
  Field *srcElement;
  HeapType local_80;
  HeapType destHeapType;
  HeapType srcHeapType;
  Type local_68;
  Type local_60;
  HeapType local_58;
  Type local_50;
  Type local_48;
  BasicType local_3c;
  Type local_38;
  Type local_30;
  Type local_28;
  Type local_20;
  ArrayCopy *local_18;
  ArrayCopy *curr_local;
  FunctionValidator *this_local;
  
  local_18 = curr;
  curr_local = (ArrayCopy *)this;
  pMVar2 = Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>::getModule
                     (&(this->
                       super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
                       ).
                       super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                       .
                       super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                     );
  bVar1 = FeatureSet::hasGC(&pMVar2->features);
  shouldBeTrue<wasm::ArrayCopy*>(this,bVar1,local_18,"array.copy requires gc [--enable-gc]");
  local_20.id = (local_18->srcIndex->type).id;
  wasm::Type::Type(&local_28,i32);
  shouldBeEqualOrFirstIsUnreachable<wasm::ArrayCopy*,wasm::Type>
            (this,local_20,local_28,local_18,"array.copy src index must be an i32");
  local_30.id = (local_18->destIndex->type).id;
  wasm::Type::Type(&local_38,i32);
  shouldBeEqualOrFirstIsUnreachable<wasm::ArrayCopy*,wasm::Type>
            (this,local_30,local_38,local_18,"array.copy dest index must be an i32");
  local_3c = unreachable;
  bVar1 = wasm::Type::operator==
                    (&(local_18->super_SpecificExpression<(wasm::Expression::Id)69>).
                      super_Expression.type,&local_3c);
  if (!bVar1) {
    local_48.id = (local_18->srcRef->type).id;
    HeapType::HeapType(&local_58,array);
    wasm::Type::Type(&local_50,local_58,Nullable);
    bVar1 = shouldBeSubType(this,local_48,local_50,(Expression *)local_18,
                            "array.copy source should be an array reference");
    if (bVar1) {
      local_60.id = (local_18->destRef->type).id;
      HeapType::HeapType(&srcHeapType,array);
      wasm::Type::Type(&local_68,srcHeapType,Nullable);
      bVar1 = shouldBeSubType(this,local_60,local_68,(Expression *)local_18,
                              "array.copy destination should be an array reference");
      if (bVar1) {
        destHeapType = wasm::Type::getHeapType(&local_18->srcRef->type);
        local_80 = wasm::Type::getHeapType(&local_18->destRef->type);
        srcElement._4_4_ = 0xb;
        bVar1 = HeapType::operator==(&destHeapType,(BasicHeapType *)((long)&srcElement + 4));
        local_d1 = 1;
        if (!bVar1) {
          bVar1 = HeapType::isArray(&destHeapType);
          bVar1 = shouldBeTrue<wasm::ArrayCopy*>
                            (this,bVar1,local_18,"array.copy source should be an array reference");
          local_d1 = bVar1 ^ 0xff;
        }
        if ((local_d1 & 1) == 0) {
          srcElement._0_4_ = 0xb;
          bVar1 = HeapType::operator==(&local_80,(BasicHeapType *)&srcElement);
          local_d2 = 1;
          if (!bVar1) {
            bVar1 = HeapType::isArray(&local_80);
            bVar1 = shouldBeTrue<wasm::ArrayCopy*>
                              (this,bVar1,local_18,
                               "array.copy destination should be an array reference");
            local_d2 = bVar1 ^ 0xff;
          }
          if ((local_d2 & 1) == 0) {
            HeapType::getArray((HeapType *)&destElement);
            local_90 = &destElement;
            HeapType::getArray((HeapType *)local_b8);
            local_a8 = local_b8;
            shouldBeSubType(this,(Type)*local_90,local_b8[0],(Expression *)local_18,
                            "array.copy must have the proper types");
            shouldBeEqual<wasm::ArrayCopy*,wasm::Field::PackedType>
                      (this,*(PackedType *)(local_90 + 1),(PackedType)local_a8[1].id,local_18,
                       "array.copy types must match");
            shouldBeTrue<wasm::ArrayCopy*>
                      (this,*(int *)((long)&local_a8[1].id + 4) != 0,local_18,
                       "array.copy destination must be mutable");
          }
        }
      }
    }
  }
  return;
}

Assistant:

void FunctionValidator::visitArrayCopy(ArrayCopy* curr) {
  shouldBeTrue(getModule()->features.hasGC(),
               curr,
               "array.copy requires gc [--enable-gc]");
  shouldBeEqualOrFirstIsUnreachable(curr->srcIndex->type,
                                    Type(Type::i32),
                                    curr,
                                    "array.copy src index must be an i32");
  shouldBeEqualOrFirstIsUnreachable(curr->destIndex->type,
                                    Type(Type::i32),
                                    curr,
                                    "array.copy dest index must be an i32");
  if (curr->type == Type::unreachable) {
    return;
  }
  if (!shouldBeSubType(curr->srcRef->type,
                       Type(HeapType::array, Nullable),
                       curr,
                       "array.copy source should be an array reference")) {
    return;
  }
  if (!shouldBeSubType(curr->destRef->type,
                       Type(HeapType::array, Nullable),
                       curr,
                       "array.copy destination should be an array reference")) {
    return;
  }
  auto srcHeapType = curr->srcRef->type.getHeapType();
  auto destHeapType = curr->destRef->type.getHeapType();
  if (srcHeapType == HeapType::none ||
      !shouldBeTrue(srcHeapType.isArray(),
                    curr,
                    "array.copy source should be an array reference")) {
    return;
  }
  if (destHeapType == HeapType::none ||
      !shouldBeTrue(destHeapType.isArray(),
                    curr,
                    "array.copy destination should be an array reference")) {
    return;
  }
  const auto& srcElement = srcHeapType.getArray().element;
  const auto& destElement = destHeapType.getArray().element;
  shouldBeSubType(srcElement.type,
                  destElement.type,
                  curr,
                  "array.copy must have the proper types");
  shouldBeEqual(srcElement.packedType,
                destElement.packedType,
                curr,
                "array.copy types must match");
  shouldBeTrue(
    destElement.mutable_, curr, "array.copy destination must be mutable");
}